

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void tlb_mmu_resize_locked
               (uc_struct_conflict15 *uc,CPUTLBDesc_conflict *desc,CPUTLBDescFast *fast,int64_t now)

{
  FILE *__stream;
  size_t sVar1;
  ulong uVar2;
  CPUTLBEntry *pCVar3;
  CPUIOTLBEntry *pCVar4;
  int *piVar5;
  char *pcVar6;
  bool bVar7;
  gsize local_90;
  size_t local_78;
  long local_70;
  size_t expected_rate;
  size_t ceil;
  _Bool window_expired;
  int64_t window_len_ns;
  int64_t window_len_ms;
  size_t new_size;
  size_t rate;
  size_t old_size;
  int64_t now_local;
  CPUTLBDescFast *fast_local;
  CPUTLBDesc_conflict *desc_local;
  uc_struct_conflict15 *uc_local;
  
  sVar1 = tlb_n_entries(fast);
  bVar7 = desc->window_begin_ns + 100000000 < now;
  if (desc->window_max_entries < desc->n_used_entries) {
    desc->window_max_entries = desc->n_used_entries;
  }
  uVar2 = (desc->window_max_entries * 100) / sVar1;
  if (uVar2 < 0x47) {
    window_len_ms = sVar1;
    if ((uVar2 < 0x1e) && (bVar7)) {
      expected_rate = pow2ceil(desc->window_max_entries);
      if (0x46 < (desc->window_max_entries * 100) / expected_rate) {
        expected_rate = expected_rate << 1;
      }
      if (expected_rate < 0x41) {
        local_78 = 0x40;
      }
      else {
        local_78 = expected_rate;
      }
      window_len_ms = local_78;
    }
  }
  else {
    if (sVar1 << 1 < 0x40000) {
      local_70 = sVar1 << 1;
    }
    else {
      local_70 = 0x40000;
    }
    window_len_ms = local_70;
  }
  if (window_len_ms == sVar1) {
    if (bVar7) {
      tlb_window_reset(desc,now,desc->n_used_entries);
    }
  }
  else {
    g_free(fast->table);
    g_free(desc->iotlb);
    tlb_window_reset(desc,now,0);
    fast->mask = (window_len_ms + -1) * 0x40;
    pCVar3 = (CPUTLBEntry *)g_try_malloc_n(window_len_ms,0x40);
    fast->table = pCVar3;
    pCVar4 = (CPUIOTLBEntry *)g_try_malloc_n(window_len_ms,0x10);
    desc->iotlb = pCVar4;
    if (desc->iotlb != (CPUIOTLBEntry *)0x0) {
      memset(desc->iotlb,0,window_len_ms << 4);
    }
    while( true ) {
      __stream = _stderr;
      bVar7 = true;
      if (fast->table != (CPUTLBEntry *)0x0) {
        bVar7 = desc->iotlb == (CPUIOTLBEntry *)0x0;
      }
      if (!bVar7) break;
      if (window_len_ms == 0x40) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        fprintf(__stream,"%s: %s.\n","tlb_mmu_resize_locked",pcVar6);
        abort();
      }
      if ((ulong)window_len_ms >> 1 < 0x41) {
        local_90 = 0x40;
      }
      else {
        local_90 = (ulong)window_len_ms >> 1;
      }
      window_len_ms = local_90;
      fast->mask = (local_90 - 1) * 0x40;
      g_free(fast->table);
      g_free(desc->iotlb);
      pCVar3 = (CPUTLBEntry *)g_try_malloc_n(local_90,0x40);
      fast->table = pCVar3;
      pCVar4 = (CPUIOTLBEntry *)g_try_malloc_n(local_90,0x10);
      desc->iotlb = pCVar4;
    }
  }
  return;
}

Assistant:

static void tlb_mmu_resize_locked(struct uc_struct *uc, CPUTLBDesc *desc, CPUTLBDescFast *fast,
                                  int64_t now)
{
    size_t old_size = tlb_n_entries(fast);
    size_t rate;
    size_t new_size = old_size;
    int64_t window_len_ms = 100;
    int64_t window_len_ns = window_len_ms * 1000 * 1000;
    bool window_expired = now > desc->window_begin_ns + window_len_ns;

    if (desc->n_used_entries > desc->window_max_entries) {
        desc->window_max_entries = desc->n_used_entries;
    }
    rate = desc->window_max_entries * 100 / old_size;

    if (rate > 70) {
        new_size = MIN(old_size << 1, 1ULL << CPU_TLB_DYN_MAX_BITS);
    } else if (rate < 30 && window_expired) {
        size_t ceil = pow2ceil(desc->window_max_entries);
        size_t expected_rate = desc->window_max_entries * 100 / ceil;

        /*
         * Avoid undersizing when the max number of entries seen is just below
         * a pow2. For instance, if max_entries == 1025, the expected use rate
         * would be 1025/2048==50%. However, if max_entries == 1023, we'd get
         * 1023/1024==99.9% use rate, so we'd likely end up doubling the size
         * later. Thus, make sure that the expected use rate remains below 70%.
         * (and since we double the size, that means the lowest rate we'd
         * expect to get is 35%, which is still in the 30-70% range where
         * we consider that the size is appropriate.)
         */
        if (expected_rate > 70) {
            ceil *= 2;
        }
        new_size = MAX(ceil, 1 << CPU_TLB_DYN_MIN_BITS);
    }

    if (new_size == old_size) {
        if (window_expired) {
            tlb_window_reset(desc, now, desc->n_used_entries);
        }
        return;
    }

    g_free(fast->table);
    g_free(desc->iotlb);

    tlb_window_reset(desc, now, 0);
    /* desc->n_used_entries is cleared by the caller */
    fast->mask = (new_size - 1) << CPU_TLB_ENTRY_BITS;
    fast->table = g_try_new(CPUTLBEntry, new_size);
    desc->iotlb = g_try_new(CPUIOTLBEntry, new_size);
    if (desc->iotlb) {
        memset(desc->iotlb, 0, sizeof(CPUIOTLBEntry) * new_size);
    }

    /*
     * If the allocations fail, try smaller sizes. We just freed some
     * memory, so going back to half of new_size has a good chance of working.
     * Increased memory pressure elsewhere in the system might cause the
     * allocations to fail though, so we progressively reduce the allocation
     * size, aborting if we cannot even allocate the smallest TLB we support.
     */
    while (fast->table == NULL || desc->iotlb == NULL) {
        if (new_size == (1 << CPU_TLB_DYN_MIN_BITS)) {
            fprintf(stderr, "%s: %s.\n", __func__, strerror(errno));
            abort();    // FIXME: do not abort
        }
        new_size = MAX(new_size >> 1, 1 << CPU_TLB_DYN_MIN_BITS);
        fast->mask = (new_size - 1) << CPU_TLB_ENTRY_BITS;

        g_free(fast->table);
        g_free(desc->iotlb);
        fast->table = g_try_new(CPUTLBEntry, new_size);
        desc->iotlb = g_try_new(CPUIOTLBEntry, new_size);
    }
}